

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cc
# Opt level: O0

string * __thiscall
iqxmlrpc::dump_request_abi_cxx11_(string *__return_storage_ptr__,iqxmlrpc *this,Request *request)

{
  bool bVar1;
  string *data;
  Param_list *t;
  byte local_ea;
  Node local_98;
  Node param;
  Value *v;
  __normal_iterator<const_iqxmlrpc::Value_*,_std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>_>
  _Stack_80;
  bool _foreach_continue38;
  auto_any_base *local_78;
  auto_any_t _foreach_end38;
  auto_any_base *local_68;
  auto_any_t _foreach_cur38;
  auto_any_t local_58;
  auto_any_t _foreach_col38;
  Node params;
  Node name;
  Node local_30;
  Node root;
  XmlBuilder writer;
  Request *request_local;
  
  XmlBuilder::XmlBuilder((XmlBuilder *)&root);
  XmlBuilder::Node::Node(&local_30,(XmlBuilder *)&root,"methodCall");
  XmlBuilder::Node::Node(&params,(XmlBuilder *)&root,"methodName");
  data = Request::get_name_abi_cxx11_((Request *)this);
  XmlBuilder::Node::set_textdata(&params,data);
  XmlBuilder::Node::~Node(&params);
  XmlBuilder::Node::Node((Node *)&_foreach_col38,(XmlBuilder *)&root,"params");
  t = Request::get_params((Request *)this);
  _foreach_cur38 =
       (auto_any_t)
       boost::foreach_detail_::
       contain<std::vector<iqxmlrpc::Value,std::allocator<iqxmlrpc::Value>>const>(t,(false_ *)0x0);
  local_58 = (auto_any_t)&_foreach_cur38;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_58);
  if (!bVar1) {
    _foreach_end38 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<std::vector<iqxmlrpc::Value,std::allocator<iqxmlrpc::Value>>,mpl_::bool_<true>>
                   (local_58,(type2type<std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>,_mpl_::bool_<true>_>
                              *)0x0,(false_ *)0x0);
    local_68 = (auto_any_base *)&_foreach_end38;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_68);
    if (!bVar1) {
      _Stack_80._M_current =
           (Value *)boost::foreach_detail_::
                    end<std::vector<iqxmlrpc::Value,std::allocator<iqxmlrpc::Value>>,mpl_::bool_<true>>
                              (local_58,(type2type<std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>,_mpl_::bool_<true>_>
                                         *)0x0,(false_ *)0x0);
      local_78 = (auto_any_base *)&stack0xffffffffffffff80;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_78);
      if (!bVar1) {
        v._7_1_ = 1;
        while( true ) {
          local_ea = 0;
          if ((v._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::vector<iqxmlrpc::Value,std::allocator<iqxmlrpc::Value>>,mpl_::bool_<true>>
                              (local_68,local_78,
                               (type2type<std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>,_mpl_::bool_<true>_>
                                *)0x0);
            local_ea = bVar1 ^ 0xff;
          }
          if ((local_ea & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&v + 7));
          if (!bVar1) {
            param.ctx = (XmlBuilder *)
                        boost::foreach_detail_::
                        deref<std::vector<iqxmlrpc::Value,std::allocator<iqxmlrpc::Value>>,mpl_::bool_<true>>
                                  (local_68,(type2type<std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>,_mpl_::bool_<true>_>
                                             *)0x0);
            while (((v._7_1_ ^ 0xff) & 1) != 0) {
              XmlBuilder::Node::Node(&local_98,(XmlBuilder *)&root,"param");
              value_to_xml((XmlBuilder *)&root,(Value *)param.ctx);
              XmlBuilder::Node::~Node(&local_98);
              v._7_1_ = 1;
            }
          }
          if ((v._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::vector<iqxmlrpc::Value,std::allocator<iqxmlrpc::Value>>,mpl_::bool_<true>>
                      (local_68,(type2type<std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>,_mpl_::bool_<true>_>
                                 *)0x0);
          }
        }
      }
    }
  }
  XmlBuilder::Node::~Node((Node *)&_foreach_col38);
  XmlBuilder::stop((XmlBuilder *)&root);
  XmlBuilder::content_abi_cxx11_(__return_storage_ptr__,(XmlBuilder *)&root);
  XmlBuilder::Node::~Node(&local_30);
  XmlBuilder::~XmlBuilder((XmlBuilder *)&root);
  return __return_storage_ptr__;
}

Assistant:

std::string
dump_request(const Request& request)
{
  XmlBuilder writer;
  XmlBuilder::Node root(writer, "methodCall");

  {
    XmlBuilder::Node name(writer, "methodName");
    name.set_textdata(request.get_name());
  }

  {
    XmlBuilder::Node params(writer, "params");
    BOOST_FOREACH(const Value& v, request.get_params()) {
      XmlBuilder::Node param(writer, "param");
      value_to_xml(writer, v);
    }
  }

  writer.stop();
  return writer.content();
}